

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O2

Type * __thiscall
spvtools::opt::analysis::TypeManager::RebuildType(TypeManager *this,uint32_t type_id,Type *type)

{
  undefined8 *puVar1;
  pointer pvVar2;
  _func_int ***ppp_Var3;
  _Head_base<0UL,_spvtools::opt::analysis::Type_*,_false> _Var4;
  pointer ppTVar5;
  int iVar6;
  uint32_t uVar7;
  Type *pTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Struct *this_00;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  _Head_base<0UL,_spvtools::opt::analysis::Type_*,_false> _Var10;
  undefined8 *puVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dec_1;
  pointer __x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x_00;
  __ireturn_type _Var12;
  _Head_base<0UL,_spvtools::opt::analysis::Type_*,_false> local_d0;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  param_types;
  bool local_9a;
  bool local_99;
  Type *local_98;
  uint local_90;
  uint local_8c;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  subtypes;
  ImageFormat local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> copy;
  AccessQualifier local_34;
  
  if (type_id == 0) {
    __assert_fail("type_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x207,
                  "Type *spvtools::opt::analysis::TypeManager::RebuildType(uint32_t, const Type &)")
    ;
  }
  local_d0._M_head_impl = (Type *)0x0;
  pTVar8 = GetType(this,type_id);
  if (pTVar8 != (Type *)0x0) {
    return pTVar8;
  }
  switch(type->kind_) {
  case kVoid:
  case kBool:
  case kInteger:
  case kFloat:
  case kSampler:
  case kOpaque:
  case kEvent:
  case kDeviceEvent:
  case kReserveId:
  case kQueue:
  case kPipe:
  case kPipeStorage:
  case kNamedBarrier:
  case kAccelerationStructureNV:
  case kRayQueryKHR:
  case kHitObjectNV:
    Type::Clone((Type *)&param_types);
    ppTVar5 = param_types.
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _Var10._M_head_impl = local_d0._M_head_impl;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0._M_head_impl = (Type *)ppTVar5;
    if ((_Var10._M_head_impl != (Type *)0x0) &&
       ((*(_Var10._M_head_impl)->_vptr_Type[1])(),
       param_types.
       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (*(code *)((*param_types.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->decorations_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)();
    }
    goto LAB_001979dc;
  case kVector:
    iVar6 = (*type->_vptr_Type[0xe])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_00,iVar6) + 0x28);
    uVar7 = GetId(this,pTVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(CONCAT44(extraout_var_00,iVar6) + 0x30));
    MakeUnique<spvtools::opt::analysis::Vector,spvtools::opt::analysis::Type*,unsigned_int>
              ((spvtools *)&param_types,(Type **)&subtypes,(uint *)&copy);
    _Var10._M_head_impl =
         (Type *)param_types.
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    break;
  case kMatrix:
    iVar6 = (*type->_vptr_Type[0x10])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_04,iVar6) + 0x28);
    uVar7 = GetId(this,pTVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(CONCAT44(extraout_var_04,iVar6) + 0x30));
    MakeUnique<spvtools::opt::analysis::Matrix,spvtools::opt::analysis::Type*,unsigned_int>
              ((spvtools *)&param_types,(Type **)&subtypes,(uint *)&copy);
    _Var10._M_head_impl =
         (Type *)param_types.
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    break;
  case kImage:
    iVar6 = (*type->_vptr_Type[0x12])(type);
    lVar9 = CONCAT44(extraout_var_07,iVar6);
    pTVar8 = *(Type **)(lVar9 + 0x28);
    uVar7 = GetId(this,pTVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(lVar9 + 0x30));
    local_8c = *(uint *)(lVar9 + 0x34);
    local_99 = *(bool *)(lVar9 + 0x38);
    local_9a = *(bool *)(lVar9 + 0x39);
    local_90 = *(uint *)(lVar9 + 0x3c);
    local_5c = *(ImageFormat *)(lVar9 + 0x40);
    local_34 = *(AccessQualifier *)(lVar9 + 0x44);
    MakeUnique<spvtools::opt::analysis::Image,spvtools::opt::analysis::Type*,spv::Dim,unsigned_int,bool,bool,unsigned_int,spv::ImageFormat,spv::AccessQualifier>
              ((spvtools *)&param_types,(Type **)&subtypes,(Dim *)&copy,&local_8c,&local_99,
               &local_9a,&local_90,&local_5c,&local_34);
    ppTVar5 = param_types.
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _Var4._M_head_impl = local_d0._M_head_impl;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0._M_head_impl = (Type *)ppTVar5;
    _Var10._M_head_impl = local_d0._M_head_impl;
    if ((_Var4._M_head_impl != (Type *)0x0) &&
       ((*(_Var4._M_head_impl)->_vptr_Type[1])(), _Var10._M_head_impl = local_d0._M_head_impl,
       param_types.
       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (*(code *)((*param_types.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->decorations_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)();
      _Var10._M_head_impl = local_d0._M_head_impl;
    }
    goto LAB_001980ef;
  case kSampledImage:
    iVar6 = (*type->_vptr_Type[0x16])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_09,iVar6) + 0x28);
    uVar7 = GetId(this,pTVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    MakeUnique<spvtools::opt::analysis::SampledImage,spvtools::opt::analysis::Type*>
              ((spvtools *)&param_types,(Type **)&subtypes);
    _Var10._M_head_impl =
         (Type *)param_types.
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    break;
  case kArray:
    iVar6 = (*type->_vptr_Type[0x18])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_05,iVar6) + 0x28);
    uVar7 = GetId(this,pTVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    MakeUnique<spvtools::opt::analysis::Array,spvtools::opt::analysis::Type*,spvtools::opt::analysis::Array::LengthInfo_const&>
              ((spvtools *)&param_types,(Type **)&subtypes,
               (LengthInfo *)(CONCAT44(extraout_var_05,iVar6) + 0x30));
    _Var10._M_head_impl =
         (Type *)param_types.
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    break;
  case kRuntimeArray:
    iVar6 = (*type->_vptr_Type[0x1a])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_06,iVar6) + 0x28);
    uVar7 = GetId(this,pTVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    MakeUnique<spvtools::opt::analysis::RuntimeArray,spvtools::opt::analysis::Type*>
              ((spvtools *)&param_types,(Type **)&subtypes);
    _Var10._M_head_impl =
         (Type *)param_types.
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    break;
  case kStruct:
    iVar6 = (*type->_vptr_Type[0x1c])(type);
    lVar9 = CONCAT44(extraout_var_08,iVar6);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::reserve(&subtypes,*(long *)(lVar9 + 0x30) - *(long *)(lVar9 + 0x28) >> 3);
    puVar1 = *(undefined8 **)(lVar9 + 0x30);
    local_98 = (Type *)lVar9;
    for (puVar11 = *(undefined8 **)(lVar9 + 0x28); puVar11 != puVar1; puVar11 = puVar11 + 1) {
      pTVar8 = (Type *)*puVar11;
      uVar7 = GetId(this,pTVar8);
      param_types.
      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
      std::
      vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
      ::emplace_back<spvtools::opt::analysis::Type_const*>
                ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                  *)&subtypes,(Type **)&param_types);
    }
    MakeUnique<spvtools::opt::analysis::Struct,std::vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>&>
              ((spvtools *)&param_types,&subtypes);
    ppTVar5 = param_types.
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _Var10._M_head_impl = local_d0._M_head_impl;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0._M_head_impl = (Type *)ppTVar5;
    if ((_Var10._M_head_impl != (Type *)0x0) &&
       ((*(_Var10._M_head_impl)->_vptr_Type[1])(),
       param_types.
       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (*(code *)((*param_types.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->decorations_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)();
    }
    this_00 = (Struct *)
              (*(code *)((Type *)(local_d0._M_head_impl)->_vptr_Type)[5].decorations_.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)();
    puVar11 = (undefined8 *)((long)local_98 + 0x58);
    local_98 = (Type *)((long)local_98 + 0x48);
    for (pTVar8 = (Type *)*puVar11; pTVar8 != local_98;
        pTVar8 = (Type *)std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar8)) {
      std::
      pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::pair((pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)&param_types,
             (pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)&pTVar8->kind_);
      ppTVar5 = param_types.
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      uVar7 = (uint32_t)
              param_types.
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
      for (__x_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    param_types.
                    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          __x_00 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppTVar5;
          __x_00 = __x_00 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,__x_00);
        Struct::AddMemberDecoration
                  (this_00,uVar7,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&param_types.
                    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    _Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::~_Vector_base(&subtypes.
                     super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   );
    _Var10._M_head_impl = local_d0._M_head_impl;
    goto LAB_001980ef;
  case kPointer:
    iVar6 = (*type->_vptr_Type[0x20])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_10,iVar6) + 0x28);
    uVar7 = GetId(this,pTVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(CONCAT44(extraout_var_10,iVar6) + 0x30));
    MakeUnique<spvtools::opt::analysis::Pointer,spvtools::opt::analysis::Type*,spv::StorageClass>
              ((spvtools *)&param_types,(Type **)&subtypes,(StorageClass *)&copy);
    _Var10._M_head_impl =
         (Type *)param_types.
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    break;
  case kFunction:
    iVar6 = (*type->_vptr_Type[0x22])(type);
    lVar9 = CONCAT44(extraout_var_03,iVar6);
    local_98 = *(Type **)(lVar9 + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::reserve(&param_types,*(long *)(lVar9 + 0x38) - *(long *)(lVar9 + 0x30) >> 3);
    puVar1 = *(undefined8 **)(lVar9 + 0x38);
    for (puVar11 = *(undefined8 **)(lVar9 + 0x30); pTVar8 = local_98, puVar11 != puVar1;
        puVar11 = puVar11 + 1) {
      pTVar8 = (Type *)*puVar11;
      uVar7 = GetId(this,pTVar8);
      subtypes.
      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
      std::
      vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
      ::emplace_back<spvtools::opt::analysis::Type_const*>
                ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                  *)&param_types,(Type **)&subtypes);
    }
    uVar7 = GetId(this,local_98);
    copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    MakeUnique<spvtools::opt::analysis::Function,spvtools::opt::analysis::Type*,std::vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>&>
              ((spvtools *)&subtypes,(Type **)&copy,&param_types);
    ppTVar5 = subtypes.
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _Var10._M_head_impl = local_d0._M_head_impl;
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0._M_head_impl = (Type *)ppTVar5;
    if ((_Var10._M_head_impl != (Type *)0x0) &&
       ((*(_Var10._M_head_impl)->_vptr_Type[1])(),
       subtypes.
       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (*(code *)((*subtypes.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->decorations_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)();
    }
    std::
    _Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::~_Vector_base(&param_types.
                     super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   );
    _Var10._M_head_impl = local_d0._M_head_impl;
    goto LAB_001980ef;
  case kForwardPointer:
    iVar6 = (*type->_vptr_Type[0x2e])(type);
    lVar9 = CONCAT44(extraout_var_01,iVar6);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(subtypes.
                           super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(lVar9 + 0x24));
    copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(lVar9 + 0x28));
    MakeUnique<spvtools::opt::analysis::ForwardPointer,unsigned_int,spv::StorageClass>
              ((spvtools *)&param_types,(uint *)&subtypes,(StorageClass *)&copy);
    ppTVar5 = param_types.
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _Var10._M_head_impl = local_d0._M_head_impl;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0._M_head_impl = (Type *)ppTVar5;
    if ((_Var10._M_head_impl != (Type *)0x0) &&
       ((*(_Var10._M_head_impl)->_vptr_Type[1])(),
       param_types.
       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (*(code *)((*param_types.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->decorations_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)();
    }
    pTVar8 = *(Type **)(lVar9 + 0x30);
    _Var10._M_head_impl = local_d0._M_head_impl;
    if (pTVar8 != (Type *)0x0) {
      lVar9 = (*(code *)((Type *)(local_d0._M_head_impl)->_vptr_Type)[9]._vptr_Type)();
      uVar7 = GetId(this,pTVar8);
      pTVar8 = RebuildType(this,uVar7,pTVar8);
      iVar6 = (*pTVar8->_vptr_Type[0x1f])(pTVar8);
      *(ulong *)(lVar9 + 0x30) = CONCAT44(extraout_var_02,iVar6);
      _Var10._M_head_impl = local_d0._M_head_impl;
    }
    goto LAB_001980ef;
  case kCooperativeMatrixNV:
    iVar6 = (*type->_vptr_Type[0x36])(type);
    lVar9 = CONCAT44(extraout_var_11,iVar6);
    pTVar8 = *(Type **)(lVar9 + 0x28);
    uVar7 = GetId(this,pTVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(lVar9 + 0x30));
    local_8c = *(uint *)(lVar9 + 0x34);
    local_90 = *(uint *)(lVar9 + 0x38);
    MakeUnique<spvtools::opt::analysis::CooperativeMatrixNV,spvtools::opt::analysis::Type*,unsigned_int,unsigned_int,unsigned_int>
              ((spvtools *)&param_types,(Type **)&subtypes,(uint *)&copy,&local_8c,&local_90);
    _Var10._M_head_impl =
         (Type *)param_types.
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    break;
  case kCooperativeMatrixKHR:
    iVar6 = (*type->_vptr_Type[0x38])(type);
    lVar9 = CONCAT44(extraout_var,iVar6);
    pTVar8 = *(Type **)(lVar9 + 0x28);
    uVar7 = GetId(this,pTVar8);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar7,pTVar8);
    copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)(lVar9 + 0x30));
    local_8c = *(uint *)(lVar9 + 0x34);
    local_90 = *(uint *)(lVar9 + 0x38);
    local_5c = *(ImageFormat *)(lVar9 + 0x3c);
    MakeUnique<spvtools::opt::analysis::CooperativeMatrixKHR,spvtools::opt::analysis::Type*,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
              ((spvtools *)&param_types,(Type **)&subtypes,(uint *)&copy,&local_8c,&local_90,
               &local_5c);
    _Var10._M_head_impl =
         (Type *)param_types.
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    break;
  default:
    __assert_fail("false && \"Unhandled type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x29f,
                  "Type *spvtools::opt::analysis::TypeManager::RebuildType(uint32_t, const Type &)")
    ;
  }
  param_types.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((local_d0._M_head_impl != (Type *)0x0) &&
     (ppp_Var3 = &(local_d0._M_head_impl)->_vptr_Type, local_d0._M_head_impl = _Var10._M_head_impl,
     (*(*ppp_Var3)[1])(), _Var10._M_head_impl = local_d0._M_head_impl,
     param_types.
     super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    (*(code *)((*param_types.
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->decorations_).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)();
    _Var10._M_head_impl = local_d0._M_head_impl;
  }
LAB_001980ef:
  local_d0._M_head_impl = _Var10._M_head_impl;
  pvVar2 = (type->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (type->decorations_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pvVar2; __x = __x + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&param_types,__x);
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)&(local_d0._M_head_impl)->decorations_,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&param_types);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&param_types);
  }
LAB_001979dc:
  _Var12 = std::__detail::
           _Insert<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>,_std::__detail::_Identity,_spvtools::opt::analysis::CompareTypeUniquePointers,_spvtools::opt::analysis::HashTypeUniquePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
           ::insert((_Insert<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>,_std::__detail::_Identity,_spvtools::opt::analysis::CompareTypeUniquePointers,_spvtools::opt::analysis::HashTypeUniquePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                     *)&this->type_pool_,(value_type *)&local_d0);
  pTVar8 = *(Type **)((long)_Var12.first.
                            super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                     + 8);
  if (local_d0._M_head_impl != (Type *)0x0) {
    (*(code *)(((Type *)(local_d0._M_head_impl)->_vptr_Type)->decorations_).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)();
  }
  return pTVar8;
}

Assistant:

Type* TypeManager::RebuildType(uint32_t type_id, const Type& type) {
  assert(type_id != 0);

  // The comparison and hash on the type pool will avoid inserting the rebuilt
  // type if an equivalent type already exists. The rebuilt type will be deleted
  // when it goes out of scope at the end of the function in that case. Repeated
  // insertions of the same Type will, at most, keep one corresponding object in
  // the type pool.
  std::unique_ptr<Type> rebuilt_ty;

  // If |type_id| is already present in the type pool, return the existing type.
  // This saves extra work in the type builder and prevents running into
  // circular issues (https://github.com/KhronosGroup/SPIRV-Tools/issues/5623).
  Type* pool_ty = GetType(type_id);
  if (pool_ty != nullptr) {
    return pool_ty;
  }

  switch (type.kind()) {
#define DefineNoSubtypeCase(kind)             \
  case Type::k##kind:                         \
    rebuilt_ty.reset(type.Clone().release()); \
    return type_pool_.insert(std::move(rebuilt_ty)).first->get()

    DefineNoSubtypeCase(Void);
    DefineNoSubtypeCase(Bool);
    DefineNoSubtypeCase(Integer);
    DefineNoSubtypeCase(Float);
    DefineNoSubtypeCase(Sampler);
    DefineNoSubtypeCase(Opaque);
    DefineNoSubtypeCase(Event);
    DefineNoSubtypeCase(DeviceEvent);
    DefineNoSubtypeCase(ReserveId);
    DefineNoSubtypeCase(Queue);
    DefineNoSubtypeCase(Pipe);
    DefineNoSubtypeCase(PipeStorage);
    DefineNoSubtypeCase(NamedBarrier);
    DefineNoSubtypeCase(AccelerationStructureNV);
    DefineNoSubtypeCase(RayQueryKHR);
    DefineNoSubtypeCase(HitObjectNV);
#undef DefineNoSubtypeCase
    case Type::kVector: {
      const Vector* vec_ty = type.AsVector();
      const Type* ele_ty = vec_ty->element_type();
      rebuilt_ty = MakeUnique<Vector>(RebuildType(GetId(ele_ty), *ele_ty),
                                      vec_ty->element_count());
      break;
    }
    case Type::kMatrix: {
      const Matrix* mat_ty = type.AsMatrix();
      const Type* ele_ty = mat_ty->element_type();
      rebuilt_ty = MakeUnique<Matrix>(RebuildType(GetId(ele_ty), *ele_ty),
                                      mat_ty->element_count());
      break;
    }
    case Type::kImage: {
      const Image* image_ty = type.AsImage();
      const Type* ele_ty = image_ty->sampled_type();
      rebuilt_ty = MakeUnique<Image>(
          RebuildType(GetId(ele_ty), *ele_ty), image_ty->dim(),
          image_ty->depth(), image_ty->is_arrayed(),
          image_ty->is_multisampled(), image_ty->sampled(), image_ty->format(),
          image_ty->access_qualifier());
      break;
    }
    case Type::kSampledImage: {
      const SampledImage* image_ty = type.AsSampledImage();
      const Type* ele_ty = image_ty->image_type();
      rebuilt_ty =
          MakeUnique<SampledImage>(RebuildType(GetId(ele_ty), *ele_ty));
      break;
    }
    case Type::kArray: {
      const Array* array_ty = type.AsArray();
      const Type* ele_ty = array_ty->element_type();
      rebuilt_ty = MakeUnique<Array>(RebuildType(GetId(ele_ty), *ele_ty),
                                     array_ty->length_info());
      break;
    }
    case Type::kRuntimeArray: {
      const RuntimeArray* array_ty = type.AsRuntimeArray();
      const Type* ele_ty = array_ty->element_type();
      rebuilt_ty =
          MakeUnique<RuntimeArray>(RebuildType(GetId(ele_ty), *ele_ty));
      break;
    }
    case Type::kStruct: {
      const Struct* struct_ty = type.AsStruct();
      std::vector<const Type*> subtypes;
      subtypes.reserve(struct_ty->element_types().size());
      for (const auto* ele_ty : struct_ty->element_types()) {
        subtypes.push_back(RebuildType(GetId(ele_ty), *ele_ty));
      }
      rebuilt_ty = MakeUnique<Struct>(subtypes);
      Struct* rebuilt_struct = rebuilt_ty->AsStruct();
      for (auto pair : struct_ty->element_decorations()) {
        uint32_t index = pair.first;
        for (const auto& dec : pair.second) {
          // Explicit copy intended.
          std::vector<uint32_t> copy(dec);
          rebuilt_struct->AddMemberDecoration(index, std::move(copy));
        }
      }
      break;
    }
    case Type::kPointer: {
      const Pointer* pointer_ty = type.AsPointer();
      const Type* ele_ty = pointer_ty->pointee_type();
      rebuilt_ty = MakeUnique<Pointer>(RebuildType(GetId(ele_ty), *ele_ty),
                                       pointer_ty->storage_class());
      break;
    }
    case Type::kFunction: {
      const Function* function_ty = type.AsFunction();
      const Type* ret_ty = function_ty->return_type();
      std::vector<const Type*> param_types;
      param_types.reserve(function_ty->param_types().size());
      for (const auto* param_ty : function_ty->param_types()) {
        param_types.push_back(RebuildType(GetId(param_ty), *param_ty));
      }
      rebuilt_ty = MakeUnique<Function>(RebuildType(GetId(ret_ty), *ret_ty),
                                        param_types);
      break;
    }
    case Type::kForwardPointer: {
      const ForwardPointer* forward_ptr_ty = type.AsForwardPointer();
      rebuilt_ty = MakeUnique<ForwardPointer>(forward_ptr_ty->target_id(),
                                              forward_ptr_ty->storage_class());
      const Pointer* target_ptr = forward_ptr_ty->target_pointer();
      if (target_ptr) {
        rebuilt_ty->AsForwardPointer()->SetTargetPointer(
            RebuildType(GetId(target_ptr), *target_ptr)->AsPointer());
      }
      break;
    }
    case Type::kCooperativeMatrixNV: {
      const CooperativeMatrixNV* cm_type = type.AsCooperativeMatrixNV();
      const Type* component_type = cm_type->component_type();
      rebuilt_ty = MakeUnique<CooperativeMatrixNV>(
          RebuildType(GetId(component_type), *component_type),
          cm_type->scope_id(), cm_type->rows_id(), cm_type->columns_id());
      break;
    }
    case Type::kCooperativeMatrixKHR: {
      const CooperativeMatrixKHR* cm_type = type.AsCooperativeMatrixKHR();
      const Type* component_type = cm_type->component_type();
      rebuilt_ty = MakeUnique<CooperativeMatrixKHR>(
          RebuildType(GetId(component_type), *component_type),
          cm_type->scope_id(), cm_type->rows_id(), cm_type->columns_id(),
          cm_type->use_id());
      break;
    }
    default:
      assert(false && "Unhandled type");
      return nullptr;
  }
  for (const auto& dec : type.decorations()) {
    // Explicit copy intended.
    std::vector<uint32_t> copy(dec);
    rebuilt_ty->AddDecoration(std::move(copy));
  }

  return type_pool_.insert(std::move(rebuilt_ty)).first->get();
}